

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,void>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>
          *alloc_ref)

{
  ctrl_t *pcVar1;
  pointer pcVar2;
  string *psVar3;
  ulong uVar4;
  ulong uVar5;
  string *psVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>
  *__p;
  
  uVar4 = this->old_capacity_;
  if (7 < uVar4) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (uVar4 < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (uVar4 != 0) {
        pcVar1 = (this->old_heap_or_soo_).heap.control;
        __p = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>
                **)((long)&this->old_heap_or_soo_ + 8);
        uVar5 = 0;
        psVar3 = *(string **)((long)&c->heap_or_soo_ + 8);
        do {
          psVar6 = psVar3 + 0x28;
          if (kSentinel < pcVar1[uVar5]) {
            *(string **)psVar6 = psVar3 + 0x38;
            pcVar2 = (__p->first)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      (psVar6,pcVar2,pcVar2 + (__p->first)._M_string_length);
            *(FeatureSet **)(psVar3 + 0x48) =
                 (__p->second)._M_t.
                 super___uniq_ptr_impl<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::FeatureSet_*,_std::default_delete<google::protobuf::FeatureSet>_>
                 .super__Head_base<0UL,_google::protobuf::FeatureSet_*,_false>._M_head_impl;
            (__p->second)._M_t.
            super___uniq_ptr_impl<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::FeatureSet_*,_std::default_delete<google::protobuf::FeatureSet>_>
            .super__Head_base<0UL,_google::protobuf::FeatureSet_*,_false>._M_head_impl =
                 (FeatureSet *)0x0;
            __gnu_cxx::
            new_allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>
            ::
            destroy<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>
                      ((new_allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>
                        *)alloc_ref,__p);
            uVar4 = this->old_capacity_;
          }
          uVar5 = uVar5 + 1;
          __p = __p + 1;
          psVar3 = psVar6;
        } while (uVar5 < uVar4);
      }
      return;
    }
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }